

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

void flatbuffers::GenField<short>
               (FieldDef *fd,Table *table,bool fixed,int indent_step,int indent,string *_text)

{
  short local_4a;
  string *_text_local;
  int indent_local;
  int indent_step_local;
  bool fixed_local;
  Table *table_local;
  FieldDef *fd_local;
  
  if (fixed) {
    local_4a = Struct::GetField<short>((Struct *)table,(fd->value).offset);
  }
  else {
    local_4a = Table::GetField<short>(table,(voffset_t)(fd->value).offset,0);
  }
  Print<short>(local_4a,(fd->value).type,indent,indent_step,(StructDef *)0x0,_text);
  return;
}

Assistant:

static void GenField(const FieldDef &fd,
                                          const Table *table, bool fixed,
                                          int indent_step, int indent,
                                          std::string *_text) {
  Print(fixed ?
    reinterpret_cast<const Struct *>(table)->GetField<T>(fd.value.offset) :
    table->GetField<T>(fd.value.offset, 0), fd.value.type, indent, indent_step,
                       nullptr, _text);
}